

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator1.cpp
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  void *pvVar3;
  SkipListIterator<Employee_*> iterator;
  ReverseListIterator<Employee_*> backward;
  ListIterator<Employee_*> forward;
  Iterator<Employee_*> local_68;
  undefined8 *local_60;
  undefined8 local_58;
  Iterator<Employee_*> local_50;
  undefined8 *local_48;
  undefined8 local_40;
  Iterator<Employee_*> local_38;
  undefined8 *local_30;
  undefined8 local_28;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  puVar1[1] = 200;
  puVar1[2] = 0;
  puVar2 = (undefined8 *)operator_new__(0x640);
  *puVar1 = puVar2;
  pvVar3 = operator_new(1);
  *puVar2 = pvVar3;
  puVar1[2] = 1;
  pvVar3 = operator_new(1);
  puVar2[1] = pvVar3;
  puVar1[2] = 2;
  pvVar3 = operator_new(1);
  puVar2[2] = pvVar3;
  puVar1[2] = 3;
  local_38._vptr_Iterator = (_func_int **)&PTR_First_00103cb8;
  local_28 = 0;
  local_50._vptr_Iterator = (_func_int **)&PTR_First_00103d10;
  local_40 = 2;
  local_48 = puVar1;
  local_30 = puVar1;
  PrintEmployees(&local_38);
  PrintEmployees(&local_50);
  puVar1 = (undefined8 *)operator_new(0x18);
  puVar1[1] = 200;
  puVar1[2] = 0;
  puVar2 = (undefined8 *)operator_new__(0x640);
  *puVar1 = puVar2;
  pvVar3 = operator_new(1);
  *puVar2 = pvVar3;
  puVar1[2] = 1;
  pvVar3 = operator_new(1);
  puVar2[1] = pvVar3;
  puVar1[2] = 2;
  pvVar3 = operator_new(1);
  puVar2[2] = pvVar3;
  puVar1[2] = 3;
  local_58 = 0;
  local_68._vptr_Iterator = (_func_int **)&PTR_First_00103d58;
  local_60 = puVar1;
  PrintEmployees(&local_68);
  return 0;
}

Assistant:

int main()
{
    // EXAMPLE 1: List

    List<Employee*>* employees;

    employees = new List<Employee*>;
    employees->Append(new Employee);
    employees->Append(new Employee);
    employees->Append(new Employee);

    ListIterator<Employee*> forward(employees);
    ReverseListIterator<Employee*> backward(employees);

    PrintEmployees(forward);
    PrintEmployees(backward);


    // EXAMPLE 2: SkipList

    SkipList<Employee*>* employees2;

    employees2 = new SkipList<Employee*>;
    employees2->Append(new Employee);
    employees2->Append(new Employee);
    employees2->Append(new Employee);

    SkipListIterator<Employee*> iterator(employees2);
    PrintEmployees(iterator);

}